

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O3

void Gia_ManTestDistance(Gia_Man_t *pGia)

{
  int iVar1;
  Emb_Man_t *p;
  long lVar2;
  long lVar3;
  int level;
  Emb_Man_t *pEVar4;
  timespec ts;
  timespec local_20;
  
  iVar1 = clock_gettime(3,&local_20);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_20.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_20.tv_sec * -1000000;
  }
  p = Emb_ManStart(pGia);
  pEVar4 = p;
  Emb_ManPrintStats(p);
  Abc_Print((int)pEVar4,"%s =","Time");
  level = 3;
  iVar1 = clock_gettime(3,&local_20);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_20.tv_nsec / 1000 + local_20.tv_sec * 1000000;
  }
  Abc_Print(level,"%9.2f sec\n",(double)(lVar3 + lVar2) / 1000000.0);
  Gia_ManTestDistanceInternal(p);
  Emb_ManStop(p);
  return;
}

Assistant:

void Gia_ManTestDistance( Gia_Man_t * pGia )
{
    Emb_Man_t * p;
    abctime clk = Abc_Clock();
    p = Emb_ManStart( pGia );
//    Emb_ManPrintFanio( p );
    Emb_ManPrintStats( p );
ABC_PRT( "Time", Abc_Clock() - clk );
    Gia_ManTestDistanceInternal( p );
    Emb_ManStop( p );
}